

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

FFSTypeHandle_conflict FFSTypeHandle_by_index(FFSContext c,int index)

{
  size_t s;
  FMFormat_conflict *pp_Var1;
  ulong uVar2;
  FFSTypeHandle_conflict *pp_Var3;
  FMFormat_conflict p_Var4;
  FFSTypeHandle_conflict p_Var5;
  FMFormat_conflict p_Var6;
  FFSTypeHandle_conflict p_Var7;
  int j;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  
  lVar12 = (long)index;
  if (c->handle_list == (FFSTypeHandle_conflict *)0x0) {
    s = lVar12 * 8 + 8;
    pp_Var3 = (FFSTypeHandle_conflict *)ffs_malloc(s);
    c->handle_list = pp_Var3;
    memset(pp_Var3,0,s);
    c->handle_list_size = index + 1;
  }
  else if (c->handle_list_size <= index) {
    iVar14 = (int)(lVar12 + 1);
    pp_Var3 = (FFSTypeHandle_conflict *)ffs_realloc(c->handle_list,(long)iVar14 * 8);
    c->handle_list = pp_Var3;
    memset(pp_Var3 + c->handle_list_size,0,((lVar12 + 1) - (long)c->handle_list_size) * 8);
    c->handle_list_size = iVar14;
  }
  if (c->handle_list[lVar12] == (FFSTypeHandle_conflict)0x0) {
    p_Var4 = FMformat_by_index(c->fmc,index);
    if (p_Var4 == (FMFormat_conflict)0x0) {
      return (FFSTypeHandle_conflict)0x0;
    }
    p_Var5 = (FFSTypeHandle_conflict)ffs_malloc(0x48);
    c->handle_list[lVar12] = p_Var5;
    p_Var5 = c->handle_list[lVar12];
    p_Var5->context = c;
    p_Var5->format_id = index;
    p_Var5->conversion = (IOConversionPtr_conflict)0x0;
    p_Var5->status = not_checked;
    p_Var6 = FMformat_by_index(c->fmc,index);
    p_Var5->body = p_Var6;
    p_Var5->is_fixed_target = 0;
    pp_Var1 = p_Var4->subformats;
    if (((pp_Var1 == (FMFormat_conflict *)0x0) || (*pp_Var1 == (FMFormat_conflict)0x0)) &&
       (p_Var4->recursive == 0)) {
      p_Var5->subformats = (FFSTypeHandle_conflict *)0x0;
      p_Var5->field_subformats = (FFSTypeHandle_conflict *)0x0;
    }
    else {
      lVar11 = 1;
      uVar2 = 0;
      do {
        uVar13 = uVar2;
        lVar11 = lVar11 + -1;
        uVar2 = uVar13 + 8;
      } while (*(long *)((long)pp_Var1 + uVar13) != 0);
      pp_Var3 = (FFSTypeHandle_conflict *)ffs_malloc(uVar13 + 8 & 0x7fffffff8);
      p_Var5->subformats = pp_Var3;
      if (lVar11 != 0) {
        lVar10 = 0;
        do {
          p_Var7 = (FFSTypeHandle_conflict)ffs_malloc(0x48);
          p_Var5->subformats[lVar10] = p_Var7;
          pp_Var3 = p_Var5->subformats;
          pp_Var3[lVar10]->context = c;
          p_Var7 = pp_Var3[lVar10];
          p_Var7->format_id = -1;
          p_Var7->conversion = (IOConversionPtr_conflict)0x0;
          p_Var7 = pp_Var3[lVar10];
          p_Var7->status = not_checked;
          p_Var7->body = p_Var4->subformats[lVar10];
          pp_Var3[lVar10]->subformats = (FFSTypeHandle_conflict *)0x0;
          lVar10 = lVar10 + 1;
        } while (-lVar10 != lVar11);
        pp_Var3 = p_Var5->subformats;
      }
      *(undefined8 *)((long)pp_Var3 + uVar13) = 0;
      pp_Var3 = (FFSTypeHandle_conflict *)ffs_malloc((long)p_Var4->field_count << 3);
      p_Var5->field_subformats = pp_Var3;
      memset(pp_Var3,0,(long)p_Var4->field_count << 3);
      iVar14 = p_Var4->field_count;
      if (0 < (long)iVar14) {
        lVar10 = 0;
        do {
          p_Var6 = p_Var4->field_subformats[lVar10];
          if (p_Var6 == (FMFormat_conflict)0x0) {
            p_Var7 = (FFSTypeHandle_conflict)0x0;
LAB_0010e6ad:
            p_Var5->field_subformats[lVar10] = p_Var7;
          }
          else {
            if (lVar11 != 0) {
              lVar8 = 0;
              do {
                if (p_Var4->field_subformats[lVar10] == p_Var5->subformats[lVar8]->body) {
                  p_Var5->field_subformats[lVar10] = p_Var5->subformats[lVar8];
                }
                lVar8 = lVar8 + 1;
              } while (-lVar8 != lVar11);
              p_Var6 = p_Var4->field_subformats[lVar10];
            }
            p_Var7 = p_Var5;
            if (p_Var6 == p_Var4) goto LAB_0010e6ad;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != iVar14);
      }
      if (lVar11 != 0) {
        lVar10 = 0;
        do {
          p_Var7 = p_Var5->subformats[lVar10];
          p_Var6 = p_Var4->subformats[lVar10];
          pp_Var3 = (FFSTypeHandle_conflict *)ffs_malloc((long)p_Var6->field_count << 3);
          p_Var7->field_subformats = pp_Var3;
          memset(pp_Var3,0,(long)p_Var6->field_count << 3);
          iVar14 = p_Var6->field_count;
          if (0 < (long)iVar14) {
            lVar8 = 0;
            do {
              if (p_Var6->field_subformats[lVar8] != (FMFormat_conflict)0x0) {
                lVar9 = 0;
                do {
                  if (p_Var6->field_subformats[lVar8] == p_Var5->subformats[lVar9]->body) {
                    p_Var7->field_subformats[lVar8] = p_Var5->subformats[lVar9];
                  }
                  lVar9 = lVar9 + 1;
                } while (-lVar9 != lVar11);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != iVar14);
          }
          lVar10 = lVar10 + 1;
        } while (-lVar10 != lVar11);
      }
    }
  }
  return c->handle_list[lVar12];
}

Assistant:

extern
FFSTypeHandle
FFSTypeHandle_by_index(FFSContext c, int index)
{
    FFSTypeHandle handle = NULL;
    if (c->handle_list == NULL) {
	c->handle_list = malloc(sizeof(c->handle_list[0]) * (index+1));
	memset(c->handle_list, 0, sizeof(c->handle_list[0]) * (index+1));
	c->handle_list_size = index + 1;
    } else if (c->handle_list_size <= index) {
	c->handle_list = realloc(c->handle_list,
				 (index+1)*sizeof(c->handle_list[0]));
	memset(&c->handle_list[c->handle_list_size], 0, 
	       sizeof(c->handle_list[0]) * ((index+1) - c->handle_list_size));
	c->handle_list_size = index + 1;
    }
    if (c->handle_list[index] == NULL) {
	FMFormat fmf = FMformat_by_index(c->fmc, index);
	if (fmf == NULL) return NULL;
	c->handle_list[index] = malloc(sizeof(struct _FFSTypeHandle));
	handle = c->handle_list[index];
	handle->context = c;
	handle->format_id = index;
	handle->conversion = NULL;
	handle->status = not_checked;
	handle->body = FMformat_by_index(c->fmc, index);
	handle->is_fixed_target = 0;
	if ((fmf->subformats && (fmf->subformats[0] != NULL)) || fmf->recursive) {
	    int i, k, subformat_count = 0;
	    while (fmf->subformats[subformat_count] != NULL) subformat_count++;
	    handle->subformats = 
		malloc(sizeof(FFSTypeHandle)*(subformat_count+1));
	    for (i = 0 ; i < subformat_count ; i++) {
		handle->subformats[i] = malloc(sizeof(*handle->subformats[i]));
		handle->subformats[i]->context = c;
		handle->subformats[i]->format_id = -1;
		handle->subformats[i]->conversion = NULL;
		handle->subformats[i]->status = not_checked;
		handle->subformats[i]->body = fmf->subformats[i];
		handle->subformats[i]->subformats = NULL;
	    }
	    handle->subformats[subformat_count] = NULL;
	    handle->field_subformats = 
		malloc(fmf->field_count * sizeof(FFSTypeHandle));
	    memset(handle->field_subformats, 0, 
		   fmf->field_count * sizeof(FFSTypeHandle));
	    for (i = 0; i < fmf->field_count; i++) {
		if (fmf->field_subformats[i] != NULL) {
		    int j;
		    for (j = 0; j < subformat_count; j++) {
			if (fmf->field_subformats[i] == handle->subformats[j]->body) {
			    handle->field_subformats[i] = handle->subformats[j];
			}
		    }
		    if (fmf->field_subformats[i] == fmf) {
			/* recursive */
			handle->field_subformats[i] = handle;
		    }
		} else {
		    handle->field_subformats[i] = NULL;
		}
	    }
	    for (k = 0; k < subformat_count ; k++) {
		FFSTypeHandle sf = handle->subformats[k];
		FMFormat sfmf = fmf->subformats[k];
		sf->field_subformats = 
		    malloc(sfmf->field_count * sizeof(FFSTypeHandle));
		memset(sf->field_subformats, 0, 
		       sfmf->field_count * sizeof(FFSTypeHandle));
		for (i = 0; i < sfmf->field_count; i++) {
		    if (sfmf->field_subformats[i] != NULL) {
			int j;
			for (j = 0; j < subformat_count; j++) {
			    if (sfmf->field_subformats[i] == handle->subformats[j]->body) {
				sf->field_subformats[i] = handle->subformats[j];
			    }
			}
		    }
		}
	    }
	} else {
	    handle->subformats = NULL;
	    handle->field_subformats = NULL;
	}
    }
    return c->handle_list[index];
}